

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O0

BOOL __thiscall
Js::ES5HeapArgumentsObject::GetItemAt
          (ES5HeapArgumentsObject *this,uint32 index,Var *value,ScriptContext *requestContext)

{
  BOOL BVar1;
  PropertyQueryFlags val;
  undefined4 local_34;
  ScriptContext *requestContext_local;
  Var *value_local;
  uint32 index_local;
  ES5HeapArgumentsObject *this_local;
  
  BVar1 = IsFormalDisconnectedFromNamedArgument(this,index);
  if (BVar1 == 0) {
    local_34 = HeapArgumentsObject::GetItemAt
                         (&this->super_HeapArgumentsObject,index,value,requestContext);
  }
  else {
    val = DynamicObject::GetItemQuery((DynamicObject *)this,this,index,value,requestContext);
    local_34 = JavascriptConversion::PropertyQueryFlagsToBoolean(val);
  }
  return local_34;
}

Assistant:

BOOL ES5HeapArgumentsObject::GetItemAt(uint32 index, Var* value, ScriptContext* requestContext)
    {
        return this->IsFormalDisconnectedFromNamedArgument(index) ?
            JavascriptConversion::PropertyQueryFlagsToBoolean(this->DynamicObject::GetItemQuery(this, index, value, requestContext)) :
            __super::GetItemAt(index, value, requestContext);
    }